

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O1

UINT8 device_start_scsp(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  float fVar5;
  UINT8 UVar6;
  uint uVar7;
  DEV_DATA DVar8;
  void *pvVar9;
  undefined1 *puVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  int (*paiVar18) [256];
  uint uVar19;
  scsp_state *scsp;
  ulong uVar20;
  int (*paiVar21) [256];
  bool bVar22;
  float fVar23;
  float fVar24;
  
  DVar8.chipInf = calloc(1,0x82e58);
  if ((DEV_DATA *)DVar8.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    uVar17 = cfg->clock;
    SCSPDSP_Init((SCSPDSP *)((long)DVar8.chipInf + 0x82688));
    *(uint *)((long)DVar8.chipInf + 0x144c) = uVar17;
    *(uint *)&((DEV_DATA *)((long)DVar8.chipInf + 0x1450))->chipInf = uVar17 >> 9;
    *(undefined2 *)((long)DVar8.chipInf + 0x1476) = 0;
    *(undefined2 *)((long)DVar8.chipInf + 0x1454) = 0;
    *(undefined4 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x1448))->chipInf = 0x80000;
    pvVar9 = malloc(0x80000);
    ((DEV_DATA *)((long)DVar8.chipInf + 0x1440))->chipInf = pvVar9;
    *(undefined4 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x82690))->chipInf = 0x40000;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x82688))->chipInf = pvVar9;
    lVar14 = 0x51e;
    iVar15 = -0xbfd;
    do {
      dVar2 = pow(10.0,(double)((float)iVar15 * 0.03125) / 20.0);
      *(int *)((long)DVar8.chipInf + lVar14 * 4) = (int)(dVar2 * 4096.0);
      lVar14 = lVar14 + 1;
      iVar15 = iVar15 + 3;
    } while (lVar14 != 0x91e);
    uVar20 = 0;
    do {
      fVar23 = 0.0;
      if ((uVar20 & 1) != 0) {
        fVar23 = -0.4;
      }
      if ((uVar20 & 2) != 0) {
        fVar23 = fVar23 + -0.8;
      }
      if ((uVar20 & 4) != 0) {
        fVar23 = fVar23 + -1.5;
      }
      if ((uVar20 & 8) != 0) {
        fVar23 = fVar23 + -3.0;
      }
      if ((uVar20 & 0x10) != 0) {
        fVar23 = fVar23 + -6.0;
      }
      if ((uVar20 & 0x20) != 0) {
        fVar23 = fVar23 + -12.0;
      }
      if ((uVar20 & 0x40) != 0) {
        fVar23 = fVar23 + -24.0;
      }
      if ((char)uVar20 < '\0') {
        fVar23 = fVar23 + -48.0;
      }
      dVar2 = pow(10.0,(double)fVar23 / 20.0);
      uVar17 = (uint)uVar20;
      fVar23 = 0.0;
      if ((~uVar17 & 0xf00) != 0) {
        fVar23 = 0.0;
        if ((uVar17 >> 8 & 1) != 0) {
          fVar23 = -3.0;
        }
        if ((uVar17 >> 9 & 1) != 0) {
          fVar23 = fVar23 + -6.0;
        }
        if ((uVar17 >> 10 & 1) != 0) {
          fVar23 = fVar23 + -12.0;
        }
        if ((uVar17 >> 0xb & 1) != 0) {
          fVar23 = fVar23 + -24.0;
        }
        dVar3 = pow(10.0,(double)fVar23 / 20.0);
        fVar23 = (float)dVar3 * 4.0;
      }
      if ((uVar17 >> 0xc & 1) == 0) {
        fVar5 = 4.0;
      }
      else {
        fVar5 = fVar23;
        fVar23 = 4.0;
      }
      fVar24 = 0.0;
      if (0x1fff < uVar20) {
        dVar3 = pow(10.0,(double)SDLT[(uint)(uVar20 >> 0xd) & 0x7ffff] / 20.0);
        fVar24 = (float)dVar3;
      }
      *(int *)((long)DVar8.chipInf + uVar20 * 4 + 0x2478) =
           (int)(long)(fVar23 * (float)dVar2 * fVar24 * 4096.0);
      *(int *)((long)DVar8.chipInf + uVar20 * 4 + 0x42478) =
           (int)(long)(fVar5 * (float)dVar2 * fVar24 * 4096.0);
      uVar20 = uVar20 + 1;
    } while (uVar20 != 0x10000);
    lVar14 = 0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x82588))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x82488))->chipInf = (void *)0x0;
    do {
      iVar15 = 0x4000000;
      if (lVar14 + 0xffffffc2U < 0xfffffffe) {
        iVar15 = (int)((1023000.0 / (ARTimes[lVar14 + 2] * 44100.0)) * 65536.0);
      }
      dVar2 = DRTimes[lVar14 + 2];
      *(int *)((long)DVar8.chipInf + lVar14 * 4 + 0x82490) = iVar15;
      *(int *)((long)DVar8.chipInf + lVar14 * 4 + 0x82590) =
           (int)((1023000.0 / (dVar2 * 44100.0)) * 65536.0);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x3e);
    puVar10 = (undefined1 *)((long)DVar8.chipInf + 0x59);
    lVar14 = 0;
    do {
      *(int *)(puVar10 + 0x6f) = (int)lVar14;
      *puVar10 = 0;
      *(undefined8 *)(puVar10 + 7) = 0;
      *(undefined4 *)(puVar10 + 0x1f) = 3;
      lVar14 = lVar14 + 1;
      puVar10 = puVar10 + 0x98;
    } while (lVar14 != 0x20);
    if (IsInit == '\0') {
      lVar14 = -0x400;
      uVar17 = 0;
      uVar19 = 0x100;
      iVar15 = 0xff;
      uVar20 = 0;
      do {
        iVar4 = (int)uVar20;
        uVar13 = uVar19 - 1;
        uVar7 = uVar13;
        if (uVar20 < 0x40) {
          uVar7 = uVar17;
        }
        *(int *)((long)PLFO_SAW + lVar14) = iVar15;
        bVar22 = uVar20 < 0x80;
        iVar11 = iVar4 + -0x100;
        if (bVar22) {
          iVar11 = iVar4;
        }
        *(int *)((long)ALFO_SQR + lVar14) = iVar11;
        uVar12 = 0;
        if (bVar22) {
          uVar12 = 0xff;
        }
        *(undefined4 *)((long)PLFO_SQR + lVar14) = uVar12;
        uVar12 = 0xffffff80;
        if (bVar22) {
          uVar12 = 0x7f;
        }
        *(undefined4 *)((long)ALFO_TRI + lVar14) = uVar12;
        if ((!bVar22) && (uVar7 = uVar19, uVar13 = uVar17 - 0x100, 0xbf < uVar20)) {
          uVar7 = iVar4 * 2 | 0xfffffe01;
        }
        *(uint *)((long)PLFO_TRI + lVar14) = uVar13;
        *(uint *)((long)ALFO_NOI + lVar14) = uVar7;
        uVar13 = rand();
        *(uint *)((long)PLFO_NOI + lVar14) = uVar13 & 0xff;
        *(uint *)((long)PSCALES[0] + lVar14) = 0x80 - (uVar13 & 0xff);
        uVar20 = uVar20 + 1;
        uVar17 = uVar17 + 2;
        uVar19 = uVar19 - 2;
        iVar15 = iVar15 + -1;
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0);
      paiVar21 = PSCALES;
      paiVar18 = ASCALES;
      lVar14 = 0;
      do {
        fVar23 = PSCALE[lVar14];
        lVar16 = 0;
        do {
          dVar2 = exp2(((double)((float)((int)lVar16 + -0x80) * fVar23) * 0.0078125) / 1200.0);
          (*paiVar21)[lVar16] = (int)(long)(dVar2 * 256.0);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x100);
        fVar23 = AMPLITUDE_SCALE_LIMIT[lVar14];
        lVar16 = 0;
        do {
          dVar2 = pow(10.0,((double)((float)(int)lVar16 * -fVar23) * 0.00390625) / 20.0);
          (*paiVar18)[lVar16] = (int)(long)(dVar2 * 256.0);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x100);
        lVar14 = lVar14 + 1;
        paiVar21 = paiVar21 + 1;
        paiVar18 = paiVar18 + 1;
      } while (lVar14 != 8);
      IsInit = '\x01';
    }
    *(undefined2 *)&((DEV_DATA *)((long)DVar8.chipInf + 0x28))->chipInf = 0;
    lVar14 = 0x5a;
    do {
      *(undefined1 *)((long)DVar8.chipInf + lVar14) = 0;
      lVar14 = lVar14 + 0x98;
    } while (lVar14 != 0x135a);
    *(void **)DVar8.chipInf = DVar8.chipInf;
    UVar1 = *(UINT32 *)((long)DVar8.chipInf + 0x1450);
    retDevInf->dataPtr = (DEV_DATA *)DVar8.chipInf;
    retDevInf->sampleRate = UVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar6 = '\0';
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_scsp(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	scsp_state *scsp;

	scsp = (scsp_state *)calloc(1, sizeof(scsp_state));
	if (scsp == NULL)
		return 0xFF;

	// init the emulation
	SCSP_Init(scsp, cfg->clock);

	scsp_set_mute_mask(scsp, 0x00000000);

	scsp->_devData.chipInf = scsp;
	INIT_DEVINF(retDevInf, &scsp->_devData, scsp->rate, &devDef);

	return 0x00;
}